

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O1

bool __thiscall
Scine::Core::ModuleManager::Impl::has(Impl *this,string *interface,string *model,string *moduleName)

{
  pointer pcVar1;
  pointer psVar2;
  element_type *peVar3;
  pointer pLVar4;
  size_t sVar5;
  byte bVar6;
  char cVar7;
  int iVar8;
  pointer pLVar9;
  LibraryAndModules *source;
  pointer psVar10;
  shared_ptr<Scine::Core::Module> *modulePtr;
  bool bVar11;
  bool bVar12;
  string modulePtrLower;
  string moduleNameLower;
  bool local_d9;
  long *local_d8;
  size_t local_d0;
  long local_c8 [2];
  long *local_b8;
  size_t local_b0;
  long local_a8 [2];
  string *local_98;
  string *local_90;
  long *local_88;
  size_t local_80;
  long local_78 [2];
  long *local_68;
  long local_60;
  long local_58 [2];
  pointer local_48;
  pointer local_40;
  locale local_38 [8];
  
  local_98 = interface;
  local_90 = model;
  std::locale::locale((locale *)&local_d8);
  pcVar1 = (moduleName->_M_dataplus)._M_p;
  local_b8 = local_a8;
  std::__cxx11::string::
  _M_construct<boost::iterators::transform_iterator<boost::algorithm::detail::to_lowerF<char>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::use_default,boost::use_default>>
            ((string *)&local_b8,pcVar1,(locale *)&local_d8,pcVar1 + moduleName->_M_string_length,
             (locale *)&local_d8);
  std::locale::~locale((locale *)&local_d8);
  if ((moduleName->_M_string_length == 0) ||
     (iVar8 = std::__cxx11::string::compare((char *)&local_b8), iVar8 == 0)) {
    pLVar4 = (this->_sources).
             super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pLVar9 = (this->_sources).
                  super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                  ._M_impl.super__Vector_impl_data._M_start; local_d9 = pLVar9 != pLVar4, local_d9;
        pLVar9 = pLVar9 + 1) {
      psVar2 = (pLVar9->modules).
               super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar10 = (pLVar9->modules).
                     super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar2;
          psVar10 = psVar10 + 1) {
        peVar3 = (psVar10->super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        cVar7 = (**(code **)(*(long *)peVar3 + 0x20))(peVar3,local_98,local_90);
        if (cVar7 != '\0') goto LAB_0010974b;
      }
    }
  }
  else {
    pLVar9 = (this->_sources).
             super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_48 = (this->_sources).
               super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_d9 = pLVar9 != local_48;
    if (local_d9) {
      do {
        psVar10 = (pLVar9->modules).
                  super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar2 = (pLVar9->modules).
                 super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (psVar10 != psVar2) {
          do {
            local_40 = pLVar9;
            (**(code **)(*(long *)(psVar10->
                                  super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr + 0x10))(&local_68);
            std::locale::locale(local_38);
            local_d8 = local_c8;
            std::__cxx11::string::
            _M_construct<boost::iterators::transform_iterator<boost::algorithm::detail::to_lowerF<char>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::use_default,boost::use_default>>
                      ((string *)&local_d8,local_68,local_38,local_60 + (long)local_68,local_38);
            std::locale::~locale(local_38);
            if (local_68 != local_58) {
              operator_delete(local_68,local_58[0] + 1);
            }
            sVar5 = local_b0;
            bVar11 = true;
            if (local_d0 == local_b0) {
              if (local_d0 == 0) {
                bVar11 = false;
              }
              else {
                iVar8 = bcmp(local_d8,local_b8,local_d0);
                bVar11 = iVar8 != 0;
              }
            }
            if (bVar11) {
              local_88 = local_78;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_88,local_b8,sVar5 + (long)local_b8);
              std::__cxx11::string::append((char *)&local_88);
              bVar12 = true;
              if (local_d0 == local_80) {
                if (local_d0 == 0) goto LAB_001096ab;
                iVar8 = bcmp(local_d8,local_88,local_d0);
                bVar12 = iVar8 != 0;
              }
            }
            else {
LAB_001096ab:
              bVar12 = false;
            }
            if ((bVar11) && (local_88 != local_78)) {
              operator_delete(local_88,local_78[0] + 1);
            }
            bVar6 = 5;
            if (!bVar12) {
              peVar3 = (psVar10->super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              bVar6 = (**(code **)(*(long *)peVar3 + 0x20))(peVar3,local_98,local_90);
            }
            if (local_d8 != local_c8) {
              operator_delete(local_d8,local_c8[0] + 1);
            }
            pLVar9 = local_40;
            if ((bVar6 != 5) && (bVar6 != 0)) goto LAB_00109727;
            psVar10 = psVar10 + 1;
          } while (psVar10 != psVar2);
          bVar6 = 0;
LAB_00109727:
          if ((bVar6 & 3) != 0) break;
        }
        pLVar9 = pLVar9 + 1;
        local_d9 = pLVar9 != local_48;
      } while (local_d9);
    }
  }
LAB_0010974b:
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  return local_d9;
}

Assistant:

bool has(const std::string& interface, const std::string& model, const std::string& moduleName) const {
    // If the module name is specified, look in detailed fashion
    std::string moduleNameLower = boost::algorithm::to_lower_copy(moduleName);
    if (!moduleName.empty() && moduleNameLower != "any") {
      for (const auto& source : _sources) {
        for (const auto& modulePtr : source.modules) {
          std::string modulePtrLower = boost::algorithm::to_lower_copy(modulePtr->name());
          if ((modulePtrLower != moduleNameLower) && (modulePtrLower != moduleNameLower + "module")) {
            continue;
          }

          if (modulePtr->has(interface, model)) {
            return true;
          }
        }
      }
      return false;
    }

    for (const auto& source : _sources) {
      for (const auto& modulePtr : source.modules) {
        if (modulePtr->has(interface, model)) {
          return true;
        }
      }
    }

    return false;
  }